

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

CompileFlag __thiscall
hypermind::ASTBlock::compile(ASTBlock *this,Compiler *compiler,CompileFlag flag)

{
  CompileUnit *pCVar1;
  pointer psVar2;
  element_type *peVar3;
  HMUINT32 HVar4;
  CompileFlag CVar5;
  shared_ptr<hypermind::ASTNode> *stmt;
  pointer psVar6;
  
  if (flag == Check) {
    CVar5 = Error;
  }
  else {
    pCVar1 = compiler->mCurCompileUnit;
    HVar4 = (this->super_ASTNode).column;
    pCVar1->mLine = (this->super_ASTNode).line;
    pCVar1->mColumn = HVar4;
    psVar2 = (this->stmts).
             super__Vector_base<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    CVar5 = Null;
    for (psVar6 = (this->stmts).
                  super__Vector_base<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1)
    {
      peVar3 = (psVar6->super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar3->_vptr_ASTNode[1])(peVar3,compiler,0);
    }
  }
  return CVar5;
}

Assistant:

AST_COMPILE(ASTBlock) {
        AST_ENTER();
        for (auto &stmt : stmts)
            stmt->compile(compiler);
        AST_LEAVE();
    }